

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O3

int ApprovalTests::
    TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::verify
              (EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  pointer pcVar1;
  string *psVar2;
  Reporter *siglen_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  StringWriter writer;
  FileOptions local_c0;
  string local_98;
  string local_78;
  StringWriter local_58;
  
  Options::scrub(&local_78,(Options *)sig,(string *)ctx);
  Options::fileOptions(&local_c0,(Options *)sig);
  psVar2 = Options::FileOptions::getFileExtension_abi_cxx11_(&local_c0);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + psVar2->_M_string_length);
  StringWriter::StringWriter(&local_58,&local_78,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.fileExtensionWithDot_._M_dataplus._M_p != &local_c0.fileExtensionWithDot_.field_2)
  {
    operator_delete(local_c0.fileExtensionWithDot_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  Options::getNamer((Options *)sig);
  siglen_00 = Options::getReporter((Options *)sig);
  FileApprover::verify
            ((EVP_PKEY_CTX *)local_c0.options_,(uchar *)&local_58,(size_t)siglen_00,tbs,tbslen);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_c0.fileExtensionWithDot_._M_dataplus._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c0.fileExtensionWithDot_._M_dataplus._M_p);
  }
  local_58.super_ApprovalWriter._vptr_ApprovalWriter = (_func_int **)&PTR__StringWriter_001656e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.ext._M_dataplus._M_p != &local_58.ext.field_2) {
    operator_delete(local_58.ext._M_dataplus._M_p);
  }
  paVar3 = &local_58.s.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.s._M_dataplus._M_p != paVar3) {
    operator_delete(local_58.s._M_dataplus._M_p);
    paVar3 = extraout_RAX;
  }
  return (int)paVar3;
}

Assistant:

static void verify(const std::string& contents,
                           const Options& options = Options())
        {
            StringWriter writer(options.scrub(contents),
                                options.fileOptions().getFileExtension());
            FileApprover::verify(*options.getNamer(), writer, options.getReporter());
        }